

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  byte bVar1;
  bool bVar2;
  handle hVar3;
  object oVar4;
  int iVar5;
  object *poVar6;
  internals *piVar7;
  _Fwd_list_node_base *p_Var8;
  size_t sVar9;
  void *__dest;
  long lVar10;
  PyObject *pPVar11;
  error_already_set *this;
  long *plVar12;
  long *plVar13;
  object *object;
  PyTypeObject *pPVar14;
  PyObject *pPVar15;
  PyTypeObject *pPVar16;
  PyTypeObject *type;
  object module;
  tuple bases;
  object name;
  object qualname;
  handle local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  handle local_118;
  allocator local_109;
  object local_108;
  object local_100;
  object local_f8;
  handle local_f0;
  getattrfunc local_e8;
  PyObject local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_108.super_handle.m_ptr = (handle)PyUnicode_FromString(rec->name);
  if (local_108.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_108.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_108.super_handle.m_ptr)->ob_refcnt + 1;
  }
  pPVar15 = (rec->scope).m_ptr;
  local_100.super_handle.m_ptr = local_108.super_handle.m_ptr;
  if (pPVar15 == (PyObject *)0x0) {
    local_140.m_ptr = (PyObject *)0x0;
LAB_00124cd6:
    std::__cxx11::string::string((string *)local_138,rec->name,(allocator *)&local_f0);
    bVar2 = false;
  }
  else {
    if (pPVar15->ob_type != (PyTypeObject *)&PyModule_Type) {
      iVar5 = PyType_IsSubtype(pPVar15->ob_type,&PyModule_Type);
      pPVar15 = (rec->scope).m_ptr;
      if (iVar5 == 0) {
        iVar5 = PyObject_HasAttrString(pPVar15,"__qualname__");
        pPVar15 = (rec->scope).m_ptr;
        if (iVar5 == 1) {
          local_128._0_8_ = "__qualname__";
          local_128._8_8_ = (PyObject *)0x0;
          local_138._8_8_ = pPVar15;
          poVar6 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                             ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138);
          local_f0.m_ptr =
               (PyObject *)
               PyUnicode_FromFormat
                         ("%U.%U",(poVar6->super_handle).m_ptr,local_108.super_handle.m_ptr);
          pybind11::object::operator=(&local_100,(object *)&local_f0);
          pybind11::object::~object((object *)&local_f0);
          pybind11::object::~object((object *)(local_128 + 8));
          pPVar15 = (rec->scope).m_ptr;
        }
      }
      local_140.m_ptr = (PyObject *)0x0;
      if (pPVar15 == (PyObject *)0x0) goto LAB_00124cd6;
    }
    local_140.m_ptr = (PyObject *)0x0;
    iVar5 = PyObject_HasAttrString(pPVar15,"__module__");
    if (iVar5 == 1) {
      local_138._8_8_ = (rec->scope).m_ptr;
      local_128._0_8_ = "__module__";
      local_128._8_8_ = (PyObject *)0x0;
      poVar6 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138);
LAB_00124c40:
      local_f0.m_ptr = (poVar6->super_handle).m_ptr;
      if (local_f0.m_ptr != (PyObject *)0x0) {
        (local_f0.m_ptr)->ob_refcnt = (local_f0.m_ptr)->ob_refcnt + 1;
      }
      pybind11::object::operator=((object *)&local_140,(object *)&local_f0);
      pybind11::object::~object((object *)&local_f0);
      pybind11::object::~object((object *)(local_128 + 8));
    }
    else {
      iVar5 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar5 == 1) {
        local_138._8_8_ = (rec->scope).m_ptr;
        local_128._0_8_ = "__name__";
        local_128._8_8_ = (PyObject *)0x0;
        poVar6 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138);
        goto LAB_00124c40;
      }
    }
    if (local_140.m_ptr == (PyObject *)0x0) goto LAB_00124cd6;
    str::str((str *)&local_f8,(object *)&local_140);
    cast<std::__cxx11::string>(&local_90,(pybind11 *)&local_f8,object);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0.m_ptr = &local_e0;
    pPVar15 = (PyObject *)(plVar12 + 2);
    if ((PyObject *)*plVar12 == pPVar15) {
      local_e0.ob_refcnt = pPVar15->ob_refcnt;
      local_e0.ob_type = (PyTypeObject *)plVar12[3];
    }
    else {
      local_e0.ob_refcnt = pPVar15->ob_refcnt;
      local_f0.m_ptr = (PyObject *)*plVar12;
    }
    local_e8 = (getattrfunc)plVar12[1];
    *plVar12 = (long)pPVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_138._0_8_ = local_128;
    pPVar14 = (PyTypeObject *)(plVar12 + 2);
    if ((PyTypeObject *)*plVar12 == pPVar14) {
      local_128._0_8_ = (pPVar14->ob_base).ob_base.ob_refcnt;
      local_128._8_8_ = plVar12[3];
    }
    else {
      local_128._0_8_ = (pPVar14->ob_base).ob_base.ob_refcnt;
      local_138._0_8_ = (PyTypeObject *)*plVar12;
    }
    local_138._8_8_ = plVar12[1];
    *plVar12 = (long)pPVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    bVar2 = true;
  }
  piVar7 = get_internals();
  p_Var8 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var8->_M_next = (_Fwd_list_node_base *)0x0;
  pPVar14 = (PyTypeObject *)(p_Var8 + 3);
  p_Var8[1]._M_next = (_Fwd_list_node_base *)pPVar14;
  if ((PyTypeObject *)local_138._0_8_ == (PyTypeObject *)local_128) {
    (pPVar14->ob_base).ob_base.ob_refcnt = local_128._0_8_;
    p_Var8[4]._M_next = (_Fwd_list_node_base *)local_128._8_8_;
  }
  else {
    p_Var8[1]._M_next = (_Fwd_list_node_base *)local_138._0_8_;
    p_Var8[3]._M_next = (_Fwd_list_node_base *)local_128._0_8_;
    pPVar14 = (PyTypeObject *)local_138._0_8_;
  }
  p_Var8[2]._M_next = (_Fwd_list_node_base *)local_138._8_8_;
  local_138._8_8_ = (PyObject *)0x0;
  local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
  p_Var8->_M_next =
       (piVar7->static_strings).
       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_head._M_next;
  (piVar7->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = p_Var8;
  local_138._0_8_ = (PyTypeObject *)local_128;
  if (bVar2) {
    if (local_f0.m_ptr != &local_e0) {
      operator_delete(local_f0.m_ptr,(ulong)(local_e0.ob_refcnt + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pybind11::object::~object(&local_f8);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar9 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar9 + 1);
    memcpy(__dest,rec->doc,sVar9 + 1);
  }
  piVar7 = get_internals();
  tuple::tuple((tuple *)&local_118,&(rec->bases).super_object);
  lVar10 = PyTuple_Size(local_118.m_ptr);
  if (lVar10 == 0) {
    pPVar15 = piVar7->instance_base;
  }
  else {
    local_138._8_8_ = local_118.m_ptr;
    local_128._0_8_ = (key_type)0x0;
    local_128._8_8_ = (PyObject *)0x0;
    poVar6 = accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_138);
    pPVar15 = (poVar6->super_handle).m_ptr;
    pybind11::object::~object((object *)(local_128 + 8));
  }
  pPVar16 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar16 == (PyTypeObject *)0x0) {
    pPVar16 = piVar7->default_metaclass;
  }
  pPVar11 = (*pPVar16->tp_alloc)(pPVar16,0);
  oVar4.super_handle.m_ptr = local_108.super_handle.m_ptr;
  if (pPVar11 == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_b0,rec->name,(allocator *)&local_d0);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_138._0_8_ = *plVar12;
    plVar13 = plVar12 + 2;
    if ((long *)local_138._0_8_ == plVar13) {
      local_128._0_8_ = *plVar13;
      local_128._8_8_ = plVar12[3];
      local_138._0_8_ = local_128;
    }
    else {
      local_128._0_8_ = *plVar13;
    }
    local_138._8_8_ = plVar12[1];
    *plVar12 = (long)plVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pybind11_fail((string *)local_138);
  }
  local_108.super_handle.m_ptr = (handle)(PyObject *)0x0;
  pPVar11[0x35].ob_refcnt = (Py_ssize_t)oVar4.super_handle.m_ptr;
  if (local_100.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)local_100.super_handle.m_ptr = *(long *)local_100.super_handle.m_ptr + 1;
  }
  pPVar11[0x36].ob_refcnt = (Py_ssize_t)local_100.super_handle.m_ptr;
  pPVar11[1].ob_type = pPVar14;
  pPVar11[0xb].ob_refcnt = (Py_ssize_t)__dest;
  pPVar15->ob_refcnt = pPVar15->ob_refcnt + 1;
  pPVar11[0x10].ob_refcnt = (Py_ssize_t)pPVar15;
  pPVar11[2].ob_refcnt = 0x38;
  lVar10 = PyTuple_Size(local_118.m_ptr);
  hVar3.m_ptr = local_118.m_ptr;
  if (lVar10 != 0) {
    local_118.m_ptr = (PyObject *)0x0;
    pPVar11[0x15].ob_refcnt = (Py_ssize_t)hVar3.m_ptr;
  }
  pPVar11[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar11[6].ob_refcnt = (Py_ssize_t)&pPVar11[0x1b].ob_type;
  pPVar11[6].ob_type = (PyTypeObject *)(pPVar11 + 0x2f);
  pPVar11[7].ob_refcnt = (Py_ssize_t)&pPVar11[0x2d].ob_type;
  pPVar14 = pPVar11[10].ob_type;
  pPVar11[10].ob_type = (PyTypeObject *)((ulong)pPVar14 | 0x600);
  bVar1 = rec->field_0x60;
  if ((bVar1 & 2) != 0) {
    pPVar11[10].ob_type = (PyTypeObject *)((ulong)pPVar14 | 0x4600);
    pPVar11[0x12].ob_refcnt = pPVar11[2].ob_refcnt;
    pPVar11[2].ob_refcnt = pPVar11[2].ob_refcnt + 8;
    pPVar11[0xb].ob_type = (PyTypeObject *)pybind11_traverse;
    pPVar11[0xc].ob_refcnt = (Py_ssize_t)pybind11_clear;
    pPVar11[0xf].ob_type = (PyTypeObject *)enable_dynamic_attributes(_heaptypeobject*)::getset;
    bVar1 = rec->field_0x60;
  }
  if ((bVar1 & 4) != 0) {
    pPVar11[10].ob_refcnt = (Py_ssize_t)(pPVar11 + 0x34);
    pPVar11[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    pPVar11[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar5 = PyType_Ready(pPVar11);
  if (iVar5 < 0) {
    std::__cxx11::string::string(local_50,rec->name,&local_109);
    plVar12 = (long *)std::__cxx11::string::append((char *)local_50);
    local_d0._M_dataplus._M_p = (pointer)*plVar12;
    plVar13 = plVar12 + 2;
    if ((long *)local_d0._M_dataplus._M_p == plVar13) {
      local_d0.field_2._M_allocated_capacity = *plVar13;
      local_d0.field_2._8_8_ = plVar12[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *plVar13;
    }
    local_d0._M_string_length = plVar12[1];
    *plVar12 = (long)plVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+(&local_b0,&local_d0,&local_70);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_138._0_8_ = *plVar12;
    plVar13 = plVar12 + 2;
    if ((long *)local_138._0_8_ == plVar13) {
      local_128._0_8_ = *plVar13;
      local_128._8_8_ = plVar12[3];
      local_138._0_8_ = local_128;
    }
    else {
      local_128._0_8_ = *plVar13;
    }
    local_138._8_8_ = plVar12[1];
    *plVar12 = (long)plVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pybind11_fail((string *)local_138);
  }
  if (((rec->field_0x60 & 2) == 0) != (((ulong)pPVar11[10].ob_type & 0x4000) == 0)) {
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/detail/class.h"
                  ,0x25d,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar15 = (rec->scope).m_ptr;
  if (pPVar15 == (PyObject *)0x0) {
    pPVar11->ob_refcnt = pPVar11->ob_refcnt + 1;
  }
  else {
    iVar5 = PyObject_SetAttrString(pPVar15,rec->name,pPVar11);
    if (iVar5 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_001251b4;
    }
  }
  if ((local_140.m_ptr == (PyObject *)0x0) ||
     (iVar5 = PyObject_SetAttrString(pPVar11,"__module__"), iVar5 == 0)) {
    pybind11::object::~object((object *)&local_118);
    pybind11::object::~object((object *)&local_140);
    pybind11::object::~object(&local_100);
    pybind11::object::~object(&local_108);
    return pPVar11;
  }
  this = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this);
LAB_001251b4:
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
#if PY_MAJOR_VERSION >= 3
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
#else
        qualname = str(rec.scope.attr("__qualname__").cast<std::string>() + "." + rec.name);
#endif
    }

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

    auto full_name = c_str(
#if !defined(PYPY_VERSION)
        module ? str(module).cast<std::string>() + "." + rec.name :
#endif
        rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *)base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);
    else
        Py_INCREF(type); // Keep it alive forever (reference leak)

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}